

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu.cpp
# Opt level: O2

int __thiscall ncnn::ELU::forward_inplace(ELU *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  int i;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  
  uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  pvVar4 = bottom_top_blob->data;
  sVar1 = bottom_top_blob->cstep;
  sVar2 = bottom_top_blob->elemsize;
  uVar3 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar3;
  }
  uVar8 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar8 = uVar3;
  }
  for (; uVar3 != uVar8; uVar3 = uVar3 + 1) {
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      fVar9 = *(float *)((long)pvVar4 + uVar5 * 4);
      if (fVar9 < 0.0) {
        fVar9 = expf(fVar9);
        *(float *)((long)pvVar4 + uVar5 * 4) = (fVar9 + -1.0) * this->alpha;
      }
    }
    pvVar4 = (void *)((long)pvVar4 + sVar1 * sVar2);
  }
  return 0;
}

Assistant:

int ELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = alpha * (expf(ptr[i]) - 1.f);
        }
    }

    return 0;
}